

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_peak2_init(ma_peak2_config *pConfig,ma_allocation_callbacks *pAllocationCallbacks,
                       ma_peak2 *pFilter)

{
  ma_allocation_callbacks *pAllocationCallbacks_00;
  long in_RDX;
  void *pHeap;
  size_t heapSizeInBytes;
  ma_result result;
  ma_peak2 *in_stack_00000038;
  ma_peak2_config *in_stack_00000040;
  ma_peak2_config *in_stack_00000048;
  size_t in_stack_ffffffffffffffc8;
  void *in_stack_ffffffffffffffd0;
  ma_result local_4;
  
  local_4 = ma_peak2_get_heap_size(in_stack_00000040,(size_t *)in_stack_00000038);
  if (local_4 == MA_SUCCESS) {
    if (in_stack_ffffffffffffffd0 == (void *)0x0) {
      pAllocationCallbacks_00 = (ma_allocation_callbacks *)0x0;
    }
    else {
      pAllocationCallbacks_00 =
           (ma_allocation_callbacks *)
           ma_malloc(in_stack_ffffffffffffffc8,(ma_allocation_callbacks *)0x21add1);
      if (pAllocationCallbacks_00 == (ma_allocation_callbacks *)0x0) {
        return MA_OUT_OF_MEMORY;
      }
    }
    local_4 = ma_peak2_init_preallocated(in_stack_00000048,in_stack_00000040,in_stack_00000038);
    if (local_4 == MA_SUCCESS) {
      *(undefined4 *)(in_RDX + 0x38) = 1;
      local_4 = MA_SUCCESS;
    }
    else {
      ma_free(in_stack_ffffffffffffffd0,pAllocationCallbacks_00);
    }
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_peak2_init(const ma_peak2_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_peak2* pFilter)
{
    ma_result result;
    size_t heapSizeInBytes;
    void* pHeap;

    result = ma_peak2_get_heap_size(pConfig, &heapSizeInBytes);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (heapSizeInBytes > 0) {
        pHeap = ma_malloc(heapSizeInBytes, pAllocationCallbacks);
        if (pHeap == NULL) {
            return MA_OUT_OF_MEMORY;
        }
    } else {
        pHeap = NULL;
    }

    result = ma_peak2_init_preallocated(pConfig, pHeap, pFilter);
    if (result != MA_SUCCESS) {
        ma_free(pHeap, pAllocationCallbacks);
        return result;
    }

    pFilter->bq._ownsHeap = MA_TRUE;    /* <-- This will cause the biquad to take ownership of the heap and free it when it's uninitialized. */
    return MA_SUCCESS;
}